

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O2

int ERR_pop_to_mark(void)

{
  byte bVar1;
  uint uVar2;
  ERR_STATE *pEVar3;
  
  pEVar3 = err_get_state();
  if (pEVar3 != (ERR_STATE *)0x0) {
    uVar2 = pEVar3->top;
    while (pEVar3->bottom != uVar2) {
      bVar1 = pEVar3->errors[uVar2].field_0x16;
      if ((bVar1 & 1) != 0) {
        pEVar3->errors[uVar2].field_0x16 = bVar1 & 0xfe;
        return 1;
      }
      err_clear(pEVar3->errors + uVar2);
      uVar2 = pEVar3->top - 1;
      if (pEVar3->top == 0) {
        uVar2 = 0xf;
      }
      pEVar3->top = uVar2;
    }
  }
  return 0;
}

Assistant:

int ERR_pop_to_mark(void) {
  ERR_STATE *const state = err_get_state();

  if (state == NULL) {
    return 0;
  }

  while (state->bottom != state->top) {
    struct err_error_st *error = &state->errors[state->top];

    if (error->mark) {
      error->mark = 0;
      return 1;
    }

    err_clear(error);
    if (state->top == 0) {
      state->top = ERR_NUM_ERRORS - 1;
    } else {
      state->top--;
    }
  }

  return 0;
}